

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

string * __thiscall
iutest::detail::ElementsAreArrayMatcher<int>::WhichIs
          (string *__return_storage_ptr__,ElementsAreArrayMatcher<int> *this,string *msg)

{
  undefined1 local_1a8 [8];
  iu_global_format_stringstream strm;
  string *msg_local;
  ElementsAreArrayMatcher<int> *this_local;
  
  strm.super_iu_stringstream._384_8_ = msg;
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a8);
  if ((this->m_expected_elem_count & 1U) == 0) {
    std::operator<<((ostream *)&strm.super_iu_stringstream.field_0x8,"ElementsAreArrayForward: ");
  }
  else {
    std::operator<<((ostream *)&strm.super_iu_stringstream.field_0x8,"ElementsAreArray: ");
  }
  std::operator<<((ostream *)&strm.super_iu_stringstream.field_0x8,
                  (string *)strm.super_iu_stringstream._384_8_);
  std::__cxx11::stringstream::str();
  iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

::std::string WhichIs(const ::std::string& msg) const
    {
        iu_global_format_stringstream strm;
        if( m_expected_elem_count )
        {
            strm << "ElementsAreArray: ";
        }
        else
        {
            strm << "ElementsAreArrayForward: ";
        }
        strm << msg;
        return strm.str();
    }